

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_read_h2(lws *wsi,uchar *buf,lws_filepos_t len)

{
  uint uVar1;
  uchar *buf_00;
  lws_filepos_t body_chunk_len;
  
  buf_00 = buf;
  do {
    if (len == 0) {
LAB_0012577d:
      return (int)buf_00 - (int)buf;
    }
    if (wsi->rxflow_bitmap != '\0') {
      lws_rxflow_cache(wsi,buf_00,0,len);
      buf_00 = buf_00 + len;
      goto LAB_0012577d;
    }
    uVar1 = lws_h2_parser(wsi,buf_00,len,&body_chunk_len);
    if ((uVar1 & 0xfffffffd) != 0) {
      _lws_log(0x10,"%s: http2_parser bail: %d\n","lws_read_h2",(ulong)uVar1);
      lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"lws_read_h2 bail");
      return -1;
    }
    buf_00 = buf_00 + body_chunk_len;
    if (uVar1 == 2) goto LAB_0012577d;
    len = len - body_chunk_len;
  } while( true );
}

Assistant:

int
lws_read_h2(struct lws *wsi, unsigned char *buf, lws_filepos_t len)
{
	unsigned char *oldbuf = buf;
	lws_filepos_t body_chunk_len;

	// lwsl_notice("%s: h2 path: wsistate 0x%x len %d\n", __func__,
	//		wsi->wsistate, (int)len);

	/*
	 * wsi here is always the network connection wsi, not a stream
	 * wsi.  Once we unpicked the framing we will find the right
	 * swsi and make it the target of the frame.
	 *
	 * If it's ws over h2, the nwsi will get us here to do the h2
	 * processing, and that will call us back with the swsi +
	 * ESTABLISHED state for the inner payload, handled in a later
	 * case.
	 */
	while (len) {
		int m;

		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lws_rxflow_cache(wsi, buf, 0, (size_t)len);
			buf += len;
			break;
		}

		/*
		 * lws_h2_parser() may send something; when it gets the
		 * whole frame, it will want to perform some action
		 * involving a reply.  But we may be in a partial send
		 * situation on the network wsi...
		 *
		 * Even though we may be in a partial send and unable to
		 * send anything new, we still have to parse the network
		 * wsi in order to gain tx credit to send, which is
		 * potentially necessary to clear the old partial send.
		 *
		 * ALL network wsi-specific frames are sent by PPS
		 * already, these are sent as a priority on the writable
		 * handler, and so respect partial sends.  The only
		 * problem is when a stream wsi wants to send an, eg,
		 * reply headers frame in response to the parsing
		 * we will do now... the *stream wsi* must stall in a
		 * different state until it is able to do so from a
		 * priority on the WRITABLE callback, same way that
		 * file transfers operate.
		 */

		m = lws_h2_parser(wsi, buf, len, &body_chunk_len);
		if (m && m != 2) {
			lwsl_debug("%s: http2_parser bail: %d\n", __func__, m);
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "lws_read_h2 bail");

			return -1;
		}
		if (m == 2) {
			/* swsi has been closed */
			buf += body_chunk_len;
			break;
		}

		buf += body_chunk_len;
		len -= body_chunk_len;
	}

	return lws_ptr_diff(buf, oldbuf);
}